

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_hc.cpp
# Opt level: O0

void __thiscall crnlib::dxt_hc::determine_tiles_task(dxt_hc *this,uint64 data,void *param_2)

{
  byte bVar1;
  color_quad_u8 (*pacVar2) [16];
  uint uVar3;
  uint uVar4;
  byte *pbVar5;
  color_quad<unsigned_char,_int> *pcVar6;
  uchar *puVar7;
  uint *puVar8;
  uchar uVar9;
  uint uVar10;
  long lVar11;
  double dVar12;
  uint local_bb8;
  uint local_b98;
  double local_b58;
  double local_b48;
  color_quad<unsigned_char,_int> *local_b18;
  uint local_b0c;
  uint local_af4;
  color_quad<unsigned_char,_int> *local_ac0;
  uint local_ab8;
  uint local_ab4;
  uint bx;
  uint by;
  uint local_aa8;
  uint a_2;
  float local_a8c;
  tile_details *ptStack_a88;
  uint t_4;
  tile_details *tile;
  uint s_1;
  uint tile_index;
  double peakSNR_1;
  double dStack_a68;
  uint a_1;
  double peakSNR;
  float local_a58;
  float quality;
  uint e_1;
  uint best_encoding;
  float best_quality;
  uint8 s;
  uint8 t_3;
  uint8 e;
  uint8 c_1;
  uint block_values [8];
  results results_1;
  params params_1;
  dxt5_endpoint_optimizer optimizer_1;
  uint8 component;
  uint a;
  uint delta;
  float fStack_57c;
  uint8 c;
  uint p;
  uint error;
  color_quad_u8 block_colors [4];
  uint16 local_55c [2];
  uint16 local_558 [2];
  uint high16;
  uint low16;
  uint size;
  color_quad_u8 *pixels;
  float local_540;
  uint t_2;
  int t_1;
  int t;
  uint bNext;
  uint tile_offset_delta;
  uint tile_offset;
  uint b;
  uint hFace;
  uint hEnd;
  uint h;
  uint faceHeight;
  uint height;
  uint width;
  float weight;
  uint level;
  int refine [4];
  float fStack_4f0;
  int scan [3];
  results results;
  undefined1 local_4b0 [8];
  params params;
  etc1_optimizer optimizer;
  uint total_error [3] [8];
  uint tile_error [3] [9];
  uint8 selectors [64];
  color_quad_u8 tilePixels [128];
  uint8 tiles [8] [4];
  uint offsets [9];
  uint num_tasks;
  void *param_2_local;
  uint64 data_local;
  dxt_hc *this_local;
  
  uVar3 = task_pool::get_num_threads(this->m_pTask_pool);
  memcpy(tiles + 6,&DAT_0022fd20,0x24);
  tilePixels[0x7e].field_0 = (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)0x8;
  tilePixels[0x7f].field_0 = (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)0x706;
  tiles[0][0] = '\x04';
  tiles[0][1] = '\x05';
  tiles[0][2] = '\0';
  tiles[0][3] = '\0';
  builtin_memcpy(tiles + 1,"\x06\x01\x03",4);
  tiles[2][0] = '\a';
  tiles[2][1] = '\0';
  tiles[2][2] = '\x02';
  tiles[2][3] = '\0';
  builtin_memcpy(tiles + 3,"\x04\x02\x03",4);
  tiles[4][0] = '\x05';
  tiles[4][1] = '\0';
  tiles[4][2] = '\x01';
  tiles[4][3] = '\0';
  tiles[5][0] = '\0';
  tiles[5][1] = '\x02';
  tiles[5][2] = '\x01';
  tiles[5][3] = '\x03';
  local_ac0 = (color_quad<unsigned_char,_int> *)(selectors + 0x38);
  do {
    color_quad<unsigned_char,_int>::color_quad(local_ac0);
    local_ac0 = local_ac0 + 1;
  } while (local_ac0 != tilePixels + 0x7e);
  etc1_optimizer::etc1_optimizer((etc1_optimizer *)&params.m_constrain_against_base_color5);
  etc1_optimizer::params::params((params *)local_4b0);
  params.m_pSrc_pixels._0_1_ = 0;
  params.m_scan_delta_size._0_1_ = 0;
  etc1_optimizer::results::results((results *)(scan + 1));
  refine[3] = -1;
  fStack_4f0 = 0.0;
  scan[0] = 1;
  weight = -NAN;
  level = 0xfffffffe;
  refine[0] = 2;
  refine[1] = 3;
  for (width = 0; width < (this->m_params).m_num_levels; width = width + 1) {
    height = (uint)(this->m_params).m_levels[width].m_weight;
    faceHeight = (this->m_params).m_levels[width].m_block_width;
    h = (this->m_params).m_levels[width].m_num_blocks / faceHeight;
    hEnd = h / (this->m_params).m_num_faces;
    hFace = (uint)((h * data) / (ulong)(uVar3 + 1)) & 0xfffffffe;
    b = (uint)(((ulong)h * (data + 1)) / (ulong)(uVar3 + 1)) & 0xfffffffe;
    tile_offset = hFace % hEnd;
    tile_offset_delta = (this->m_params).m_levels[width].m_first_block + hFace * faceHeight;
    for (; hFace < b; hFace = hFace + 2) {
      bNext = tile_offset_delta;
      t = 4;
      if (tile_offset == hEnd) {
        tile_offset = 0;
      }
      else if ((tile_offset & 2) != 0) {
        t = -4;
        bNext = faceHeight * 2 + -4 + tile_offset_delta;
      }
      t_1 = tile_offset_delta + faceHeight;
      for (; tile_offset_delta < (uint)t_1; tile_offset_delta = tile_offset_delta + 2) {
        for (t_2 = 0; (int)t_2 < 0x40; t_2 = t_2 + 0x10) {
          if ((t_2 & 0x10) == 0) {
            local_af4 = 0;
          }
          else {
            local_af4 = faceHeight;
          }
          memcpy(tilePixels + (long)(int)t_2 + -2,
                 this->m_blocks + (tile_offset_delta + local_af4 + (uint)((t_2 & 0x20) != 0)),0x40);
        }
        for (local_540 = 0.0; (int)local_540 < 0x40; local_540 = (float)((int)local_540 + 4)) {
          pacVar2 = this->m_blocks;
          if (((uint)local_540 & 0x20) == 0) {
            local_b0c = 0;
          }
          else {
            local_b0c = faceHeight;
          }
          uVar10 = tile_offset_delta + local_b0c + (uint)(((uint)local_540 & 4) != 0);
          lVar11 = (long)(int)((int)local_540 >> 1 & 0xc);
          *(undefined8 *)(tilePixels + (long)(int)local_540 + 0x3e) =
               *(undefined8 *)(pacVar2[uVar10] + lVar11);
          *(undefined8 *)(tilePixels + (long)(int)local_540 + 0x40) =
               *(undefined8 *)(pacVar2[uVar10] + lVar11 + 2);
        }
        for (pixels._4_4_ = 0; pixels._4_4_ < 9; pixels._4_4_ = pixels._4_4_ + 1) {
          _low16 = tilePixels + ((ulong)(uint)tiles[(ulong)pixels._4_4_ + 6] - 2);
          high16 = 0x10 << ((byte)(pixels._4_4_ >> 2) & 0x1f);
          if ((this->m_has_etc_color_blocks & 1U) == 0) {
            if ((this->m_has_color_blocks & 1U) != 0) {
              dxt_fast::compress_color_block
                        (high16,_low16,(uint *)local_558,(uint *)local_55c,
                         (uint8 *)(tile_error[2] + 8),false);
              local_b18 = (color_quad<unsigned_char,_int> *)&p;
              do {
                color_quad<unsigned_char,_int>::color_quad(local_b18);
                local_b18 = local_b18 + 1;
              } while (local_b18 != block_colors + 2);
              dxt1_block::get_block_colors4((color_quad_u8 *)&p,local_558[0],local_55c[0]);
              fStack_57c = 0.0;
              for (delta = 0; delta < high16; delta = delta + 1) {
                for (a._3_1_ = 0; a._3_1_ < 3; a._3_1_ = a._3_1_ + 1) {
                  pbVar5 = color_quad<unsigned_char,_int>::operator[](_low16 + delta,(uint)a._3_1_);
                  bVar1 = *pbVar5;
                  pbVar5 = color_quad<unsigned_char,_int>::operator[]
                                     ((color_quad<unsigned_char,_int> *)
                                      (&p + *(byte *)((long)tile_error[2] + (ulong)delta + 0x20)),
                                      (uint)a._3_1_);
                  fStack_57c = (float)(((uint)bVar1 - (uint)*pbVar5) * ((uint)bVar1 - (uint)*pbVar5)
                                      + (int)fStack_57c);
                }
              }
              tile_error[-1][(ulong)pixels._4_4_ + 7] = (uint)fStack_57c;
            }
          }
          else {
            params.super_crn_etc1_pack_params.m_quality = high16;
            params._8_8_ = _low16;
            etc1_optimizer::init
                      ((etc1_optimizer *)&params.m_constrain_against_base_color5,
                       (EVP_PKEY_CTX *)local_4b0);
            params._24_8_ = refine + 3;
            params.m_pScan_deltas._0_4_ = 3;
            etc1_optimizer::compute((etc1_optimizer *)&params.m_constrain_against_base_color5);
            if ((ulong)(params.super_crn_etc1_pack_params.m_quality * 0x177) < (ulong)scan._4_8_) {
              params._24_8_ = &weight;
              params.m_pScan_deltas._0_4_ = 4;
              etc1_optimizer::compute((etc1_optimizer *)&params.m_constrain_against_base_color5);
            }
            tile_error[-1][(ulong)pixels._4_4_ + 7] = (uint)scan._4_8_;
          }
          for (optimizer_1.m_flags.m_ppGroups._4_4_ = 0;
              optimizer_1.m_flags.m_ppGroups._4_4_ < this->m_num_alpha_blocks;
              optimizer_1.m_flags.m_ppGroups._4_4_ = optimizer_1.m_flags.m_ppGroups._4_4_ + 1) {
            uVar4 = (this->m_params).m_alpha_component_indices[optimizer_1.m_flags.m_ppGroups._4_4_]
            ;
            dxt5_endpoint_optimizer::dxt5_endpoint_optimizer
                      ((dxt5_endpoint_optimizer *)&params_1.m_quality);
            dxt5_endpoint_optimizer::params::params((params *)&results_1.m_first_endpoint);
            params_1._0_8_ = _low16;
            params_1.m_pPixels._0_4_ = high16;
            params_1.m_pPixels._4_4_ = (uint)(byte)uVar4;
            params_1.m_comp_index._0_1_ = 0;
            params_1.m_num_pixels = 2;
            block_values._24_8_ = tile_error[2] + 8;
            dxt5_endpoint_optimizer::compute
                      ((dxt5_endpoint_optimizer *)&params_1.m_quality,
                       (params *)&results_1.m_first_endpoint,(results *)(block_values + 6));
            dxt5_block::get_block_values8
                      ((uint *)&best_quality,(uint)(byte)results_1.m_error,
                       (uint)results_1.m_error._1_1_);
            tile_error[(ulong)(optimizer_1.m_flags.m_ppGroups._4_4_ + 1) - 1]
            [(ulong)pixels._4_4_ + 7] = (uint)results_1.m_pSelectors;
            dxt5_endpoint_optimizer::~dxt5_endpoint_optimizer
                      ((dxt5_endpoint_optimizer *)&params_1.m_quality);
          }
        }
        for (best_encoding._3_1_ = (this->m_has_color_blocks & 1U) == 0;
            (uint)best_encoding._3_1_ < this->m_num_alpha_blocks + 1;
            best_encoding._3_1_ = best_encoding._3_1_ + 1) {
          for (best_encoding._2_1_ = 0; best_encoding._2_1_ < 8;
              best_encoding._2_1_ = best_encoding._2_1_ + 1) {
            total_error[(ulong)best_encoding._3_1_ - 1][(ulong)best_encoding._2_1_ + 6] = 0;
            best_encoding._1_1_ = 0;
            for (best_encoding._0_1_ = best_encoding._2_1_ + 1; (byte)best_encoding != 0;
                best_encoding._0_1_ = (byte)((int)(uint)(byte)best_encoding >> 1)) {
              total_error[(ulong)best_encoding._3_1_ - 1][(ulong)best_encoding._2_1_ + 6] =
                   tile_error[(ulong)best_encoding._3_1_ - 1]
                   [(ulong)tilePixels[(ulong)best_encoding._2_1_ + 0x7e].field_0.c
                           [best_encoding._1_1_] + 7] +
                   total_error[(ulong)best_encoding._3_1_ - 1][(ulong)best_encoding._2_1_ + 6];
              best_encoding._1_1_ = best_encoding._1_1_ + 1;
            }
          }
        }
        e_1 = 0;
        quality = 0.0;
        for (local_a58 = 0.0; (uint)local_a58 < 8; local_a58 = (float)((int)local_a58 + 1)) {
          peakSNR._4_4_ = 0.0;
          if ((this->m_has_color_blocks & 1U) != 0) {
            if (total_error[-1][(ulong)(uint)local_a58 + 6] == 0) {
              local_b48 = 999999.0;
            }
            else {
              dVar12 = sqrt((double)total_error[-1][(ulong)(uint)local_a58 + 6] / 192.0);
              local_b48 = log10(255.0 / dVar12);
              local_b48 = local_b48 * 20.0;
            }
            dStack_a68 = local_b48;
            dVar12 = math::maximum<double>
                               (local_b48 - (double)this->m_color_derating[width][(uint)local_a58],
                                0.0);
            peakSNR._4_4_ = (float)dVar12;
            if (this->m_num_alpha_blocks != 0) {
              peakSNR._4_4_ =
                   (this->m_params).m_adaptive_tile_color_alpha_weighting_ratio * peakSNR._4_4_;
            }
          }
          for (peakSNR_1._4_4_ = 0; peakSNR_1._4_4_ < this->m_num_alpha_blocks;
              peakSNR_1._4_4_ = peakSNR_1._4_4_ + 1) {
            if (total_error[(ulong)(peakSNR_1._4_4_ + 1) - 1][(ulong)(uint)local_a58 + 6] == 0) {
              local_b58 = 999999.0;
            }
            else {
              dVar12 = sqrt((double)total_error[(ulong)(peakSNR_1._4_4_ + 1) - 1]
                                    [(ulong)(uint)local_a58 + 6] / 64.0);
              local_b58 = log10(255.0 / dVar12);
              local_b58 = local_b58 * 20.0;
            }
            _s_1 = local_b58;
            dVar12 = math::maximum<double>
                               (local_b58 - (double)this->m_alpha_derating[(uint)local_a58],0.0);
            peakSNR._4_4_ = (float)dVar12 + peakSNR._4_4_;
          }
          if ((float)e_1 < peakSNR._4_4_) {
            e_1 = (uint)peakSNR._4_4_;
            quality = local_a58;
          }
        }
        tile._4_4_ = 0;
        for (tile._0_4_ = (int)quality + 1; (uint)tile != 0; tile._0_4_ = (uint)tile >> 1) {
          ptStack_a88 = vector<crnlib::dxt_hc::tile_details>::operator[]
                                  (&this->m_tiles,bNext | tile._4_4_);
          local_a8c = (float)(uint)tilePixels[(ulong)(uint)quality + 0x7e].field_0.c[tile._4_4_];
          vector<crnlib::color_quad<unsigned_char,_int>_>::append
                    (&ptStack_a88->pixels,
                     tilePixels + ((ulong)(uint)tiles[(ulong)(uint)local_a8c + 6] - 2),
                     0x10 << (tilePixels[(ulong)(uint)quality + 0x7e].field_0.c[tile._4_4_] >> 2 &
                             0x1f));
          ptStack_a88->weight = (float)height;
          if ((this->m_has_color_blocks & 1U) != 0) {
            pcVar6 = vector<crnlib::color_quad<unsigned_char,_int>_>::get_ptr(&ptStack_a88->pixels);
            uVar4 = vector<crnlib::color_quad<unsigned_char,_int>_>::size(&ptStack_a88->pixels);
            palettize_color((vec6F *)&stack0xfffffffffffff55c,this,pcVar6,uVar4);
            vec<6U,_float>::operator=
                      (&ptStack_a88->color_endpoint,(vec<6U,_float> *)&stack0xfffffffffffff55c);
          }
          for (local_aa8 = 0; local_aa8 < this->m_num_alpha_blocks; local_aa8 = local_aa8 + 1) {
            pcVar6 = vector<crnlib::color_quad<unsigned_char,_int>_>::get_ptr(&ptStack_a88->pixels);
            uVar4 = vector<crnlib::color_quad<unsigned_char,_int>_>::size(&ptStack_a88->pixels);
            palettize_alpha((dxt_hc *)&bx,(color_quad_u8 *)this,(uint)pcVar6,uVar4);
            vec<2U,_float>::operator=
                      (ptStack_a88->alpha_endpoints + local_aa8,(vec<2U,_float> *)&bx);
          }
          tile._4_4_ = tile._4_4_ + 1;
        }
        for (local_ab4 = 0; local_ab4 < 2; local_ab4 = local_ab4 + 1) {
          for (local_ab8 = 0; local_ab8 < 2; local_ab8 = local_ab8 + 1) {
            uVar9 = SUB41(quality,0);
            if (local_ab4 == 0) {
              local_b98 = 0;
            }
            else {
              local_b98 = faceHeight;
            }
            puVar7 = vector<unsigned_char>::operator[]
                               (&this->m_block_encodings,tile_offset_delta + local_b98 + local_ab8);
            *puVar7 = uVar9;
            uVar10 = bNext | (byte)g_tile_map
                                   [(ulong)local_ab8 +
                                    (ulong)local_ab4 * 2 + (ulong)(uint)quality * 4];
            if (local_ab4 == 0) {
              local_bb8 = 0;
            }
            else {
              local_bb8 = faceHeight;
            }
            puVar8 = vector<unsigned_int>::operator[]
                               (&this->m_tile_indices,tile_offset_delta + local_bb8 + local_ab8);
            *puVar8 = uVar10;
          }
        }
        bNext = t + bNext;
      }
      tile_offset = tile_offset + 2;
      tile_offset_delta = faceHeight + tile_offset_delta;
    }
  }
  etc1_optimizer::~etc1_optimizer((etc1_optimizer *)&params.m_constrain_against_base_color5);
  return;
}

Assistant:

void dxt_hc::determine_tiles_task(uint64 data, void*)
    {
        uint num_tasks = m_pTask_pool->get_num_threads() + 1;
        uint offsets[9] = { 0, 16, 32, 48, 0, 32, 64, 96, 64 };
        uint8 tiles[8][4] = { { 8 }, { 6, 7 }, { 4, 5 }, { 6, 1, 3 }, { 7, 0, 2 }, { 4, 2, 3 }, { 5, 0, 1 }, { 0, 2, 1, 3 } };
        color_quad_u8 tilePixels[128];
        uint8 selectors[64];
        uint tile_error[3][9];
        uint total_error[3][8];

        etc1_optimizer optimizer;
        etc1_optimizer::params params;
        params.m_use_color4 = false;
        params.m_constrain_against_base_color5 = false;
        etc1_optimizer::results results;
        results.m_pSelectors = selectors;
        int scan[] = { -1, 0, 1 };
        int refine[] = { -3, -2, 2, 3 };

        for (uint level = 0; level < m_params.m_num_levels; level++)
        {
            float weight = m_params.m_levels[level].m_weight;
            uint width = m_params.m_levels[level].m_block_width;
            uint height = m_params.m_levels[level].m_num_blocks / width;
            uint faceHeight = height / m_params.m_num_faces;
            uint h = height * data / num_tasks & ~1;
            uint hEnd = height * (data + 1) / num_tasks & ~1;
            uint hFace = h % faceHeight;
            uint b = m_params.m_levels[level].m_first_block + h * width;

            for (; h < hEnd; h += 2, hFace += 2, b += width)
            {
                uint tile_offset = b;
                uint tile_offset_delta = 4;
                if (hFace == faceHeight)
                {
                    hFace = 0;
                }
                else if (hFace & 2)
                {
                    tile_offset_delta = -4;
                    tile_offset += (width << 1) + tile_offset_delta;
                }
                for (uint bNext = b + width; b < bNext; b += 2, tile_offset += tile_offset_delta)
                {
                    for (int t = 0; t < 64; t += 16)
                    {
                        memcpy(tilePixels + t, m_blocks[b + (t & 16 ? width : 0) + (t & 32 ? 1 : 0)], 64);
                    }
                    for (int t = 0; t < 64; t += 4)
                    {
                        memcpy(tilePixels + 64 + t, m_blocks[b + (t & 32 ? width : 0) + (t & 4 ? 1 : 0)] + (t >> 1 & 12), 16);
                    }

                    for (uint t = 0; t < 9; t++)
                    {
                        color_quad_u8* pixels = tilePixels + offsets[t];
                        uint size = 16 << (t >> 2);
                        if (m_has_etc_color_blocks)
                        {
                            params.m_pSrc_pixels = pixels;
                            params.m_num_src_pixels = results.m_n = size;
                            optimizer.init(params, results);
                            params.m_pScan_deltas = scan;
                            params.m_scan_delta_size = sizeof(scan) / sizeof(*scan);
                            optimizer.compute();
                            if (results.m_error > 375 * params.m_num_src_pixels)
                            {
                                params.m_pScan_deltas = refine;
                                params.m_scan_delta_size = sizeof(refine) / sizeof(*refine);
                                optimizer.compute();
                            }
                            tile_error[cColor][t] = results.m_error;
                        }
                        else if (m_has_color_blocks)
                        {
                            uint low16, high16;
                            dxt_fast::compress_color_block(size, pixels, low16, high16, selectors);
                            color_quad_u8 block_colors[4];
                            dxt1_block::get_block_colors4(block_colors, low16, high16);
                            uint error = 0;
                            for (uint p = 0; p < size; p++)
                            {
                                for (uint8 c = 0; c < 3; c++)
                                {
                                    uint delta = pixels[p][c] - block_colors[selectors[p]][c];
                                    error += delta * delta;
                                }
                            }
                            tile_error[cColor][t] = error;
                        }
                        for (uint a = 0; a < m_num_alpha_blocks; a++)
                        {
                            uint8 component = m_params.m_alpha_component_indices[a];
                            dxt5_endpoint_optimizer optimizer;
                            dxt5_endpoint_optimizer::params params;
                            dxt5_endpoint_optimizer::results results;
                            params.m_pPixels = pixels;
                            params.m_num_pixels = size;
                            params.m_comp_index = component;
                            params.m_use_both_block_types = false;
                            params.m_quality = cCRNDXTQualityNormal;
                            results.m_pSelectors = selectors;
                            optimizer.compute(params, results);
                            uint block_values[cDXT5SelectorValues];
                            dxt5_block::get_block_values8(block_values, results.m_first_endpoint, results.m_second_endpoint);
                            tile_error[cAlpha0 + a][t] = results.m_error;
                        }
                    }

                    for (uint8 c = m_has_color_blocks ? 0 : cAlpha0; c < cAlpha0 + m_num_alpha_blocks; c++)
                    {
                        for (uint8 e = 0; e < 8; e++)
                        {
                            total_error[c][e] = 0;
                            for (uint8 t = 0, s = e + 1; s; s >>= 1, t++)
                            {
                                total_error[c][e] += tile_error[c][tiles[e][t]];
                            }
                        }
                    }

                    float best_quality = 0.0f;
                    uint best_encoding = 0;
                    for (uint e = 0; e < 8; e++)
                    {
                        float quality = 0;
                        if (m_has_color_blocks)
                        {
                            double peakSNR = total_error[cColor][e] ? log10(255.0f / sqrt(total_error[cColor][e] / 192.0)) * 20.0f : 999999.0f;
                            quality = (float)math::maximum<double>(peakSNR - m_color_derating[level][e], 0.0f);
                            if (m_num_alpha_blocks)
                            {
                                quality *= m_params.m_adaptive_tile_color_alpha_weighting_ratio;
                            }
                        }
                        for (uint a = 0; a < m_num_alpha_blocks; a++)
                        {
                            double peakSNR = total_error[cAlpha0 + a][e] ? log10(255.0f / sqrt(total_error[cAlpha0 + a][e] / 64.0)) * 20.0f : 999999.0f;
                            quality += (float)math::maximum<double>(peakSNR - m_alpha_derating[e], 0.0f);
                        }
                        if (quality > best_quality)
                        {
                            best_quality = quality;
                            best_encoding = e;
                        }
                    }

                    for (uint tile_index = 0, s = best_encoding + 1; s; s >>= 1, tile_index++)
                    {
                        tile_details& tile = m_tiles[tile_offset | tile_index];
                        uint t = tiles[best_encoding][tile_index];
                        tile.pixels.append(tilePixels + offsets[t], 16 << (t >> 2));
                        tile.weight = weight;
                        if (m_has_color_blocks)
                        {
                            tile.color_endpoint = palettize_color(tile.pixels.get_ptr(), tile.pixels.size());
                        }
                        for (uint a = 0; a < m_num_alpha_blocks; a++)
                        {
                            tile.alpha_endpoints[a] = palettize_alpha(tile.pixels.get_ptr(), tile.pixels.size(), m_params.m_alpha_component_indices[a]);
                        }
                    }

                    for (uint by = 0; by < 2; by++)
                    {
                        for (uint bx = 0; bx < 2; bx++)
                        {
                            m_block_encodings[b + (by ? width : 0) + bx] = best_encoding;
                            m_tile_indices[b + (by ? width : 0) + bx] = tile_offset | g_tile_map[best_encoding][by][bx];
                        }
                    }
                }
            }
        }
    }